

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EndpointInfo.cpp
# Opt level: O3

void __thiscall
helics::EndpointInfo::checkInterfacesForIssues
          (EndpointInfo *this,
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *issues)

{
  int iVar1;
  pointer pEVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  iterator __end4;
  ulong uVar6;
  _Alloc_hider _Var7;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  iterator __begin4;
  pointer __args;
  pointer pEVar8;
  EndpointInformation *trg;
  pointer __args_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  set<helics::GlobalHandle,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
  handles;
  Errors local_bc;
  string local_b8;
  undefined1 local_98 [32];
  _Base_ptr local_78;
  ulong local_70;
  string local_68;
  ulong local_48;
  
  if (this->targetedEndpoint == true) {
    if (((this->required == true) &&
        ((this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->sourceInformation).
         super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
         ._M_impl.super__Vector_impl_data._M_finish)) &&
       ((this->targetInformation).
        super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->targetInformation).
        super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_b8._M_dataplus._M_p._0_4_ = 0xfffffffe;
      local_98._0_8_ = (this->key)._M_dataplus._M_p;
      local_98._8_8_ = (this->key)._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x2e;
      args.field_1.values_ = in_R9.values_;
      args.desc_ = (unsigned_long_long)local_98;
      ::fmt::v11::vformat_abi_cxx11_
                (&local_68,(v11 *)"Endpoint {} is required but has no connections",fmt,args);
      std::
      vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
      ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                  *)issues,(Errors *)&local_b8,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,
                        CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                                 local_68.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    iVar1 = this->requiredConnections;
    if (0 < (long)iVar1) {
      pEVar8 = (this->targetInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      __args_00 = (this->targetInformation).
                  super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ((long)pEVar8 - (long)__args_00 >> 3) * -0x71c71c71c71c71c7;
      __args = (this->sourceInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pEVar2 = (this->sourceInformation).
               super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar4 = (long)pEVar2 - (long)__args >> 3;
      uVar5 = lVar4 * -0x71c71c71c71c71c7;
      uVar6 = uVar5;
      if (uVar5 <= uVar3 && uVar3 + lVar4 * 0x71c71c71c71c71c7 != 0) {
        uVar6 = uVar3;
      }
      if ((ulong)(long)iVar1 < uVar6) {
        if (iVar1 == 1) {
          local_b8._M_dataplus._M_p._0_4_ = 0xfffffffe;
          local_98._0_8_ = (this->key)._M_dataplus._M_p;
          local_98._8_8_ = (this->key)._M_string_length;
          fmt_00.size_ = 0xd;
          fmt_00.data_ = (char *)0x42;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_98;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_68,
                     (v11 *)"Endpoint {} is single source only but has more than one connection",
                     fmt_00,args_00);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,(Errors *)&local_b8,&local_68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p == &local_68.field_2) {
            return;
          }
          local_98._16_8_ =
               CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                        local_68.field_2._M_allocated_capacity._0_4_);
          _Var7._M_p = local_68._M_dataplus._M_p;
        }
        else {
          local_b8._M_dataplus._M_p._0_4_ = 0xfffffffe;
          local_68._M_dataplus._M_p = (this->key)._M_dataplus._M_p;
          local_68._M_string_length = (this->key)._M_string_length;
          fmt_02.size_ = 0x41d;
          fmt_02.data_ = (char *)0x37;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)&local_68;
          local_68.field_2._M_allocated_capacity._0_4_ = iVar1;
          local_48 = uVar6;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)local_98,
                     (v11 *)"Endpoint {} requires {} connections but has at least {}",fmt_02,args_02
                    );
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,(Errors *)&local_b8,(string *)local_98);
          _Var7._M_p = (pointer)local_98._0_8_;
          if ((undefined1 *)local_98._0_8_ == local_98 + 0x10) {
            return;
          }
        }
        operator_delete(_Var7._M_p,(ulong)((long)&((_Base_ptr)local_98._16_8_)->_M_color + 1));
      }
      else if (iVar1 != (int)uVar5 + (int)uVar3) {
        local_98._24_8_ = local_98 + 8;
        local_98._8_8_ = local_98._8_8_ & 0xffffffff00000000;
        local_98._16_8_ = (_Base_ptr)0x0;
        local_70 = 0;
        local_78 = (_Base_ptr)local_98._24_8_;
        if (__args != pEVar2) {
          do {
            std::
            _Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
            ::_M_emplace_unique<helics::GlobalHandle_const&>
                      ((_Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                        *)local_98,&__args->id);
            __args = __args + 1;
          } while (__args != pEVar2);
          __args_00 = (this->targetInformation).
                      super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          pEVar8 = (this->targetInformation).
                   super__Vector_base<helics::EndpointInformation,_std::allocator<helics::EndpointInformation>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
        if (__args_00 != pEVar8) {
          do {
            std::
            _Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
            ::_M_emplace_unique<helics::GlobalHandle_const&>
                      ((_Rb_tree<helics::GlobalHandle,helics::GlobalHandle,std::_Identity<helics::GlobalHandle>,std::less<helics::GlobalHandle>,std::allocator<helics::GlobalHandle>>
                        *)local_98,&__args_00->id);
            __args_00 = __args_00 + 1;
          } while (__args_00 != pEVar8);
        }
        if (this->requiredConnections != (int)local_70) {
          local_bc = CONNECTION_FAILURE;
          local_68._M_dataplus._M_p = (this->key)._M_dataplus._M_p;
          local_68._M_string_length = (this->key)._M_string_length;
          local_48 = local_70;
          fmt_01.size_ = 0x41d;
          fmt_01.data_ = (char *)0x33;
          args_01.field_1.values_ = in_R9.values_;
          args_01.desc_ = (unsigned_long_long)&local_68;
          local_68.field_2._M_allocated_capacity._0_4_ = this->requiredConnections;
          ::fmt::v11::vformat_abi_cxx11_
                    (&local_b8,(v11 *)"Endpoint {} requires {} connections but has only {}",fmt_01,
                     args_01);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<helics::defs::Errors,std::__cxx11::string>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)issues,&local_bc,&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_) !=
              &local_b8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_b8._M_dataplus._M_p._4_4_,local_b8._M_dataplus._M_p._0_4_
                                    ),local_b8.field_2._M_allocated_capacity + 1);
          }
        }
        std::
        _Rb_tree<helics::GlobalHandle,_helics::GlobalHandle,_std::_Identity<helics::GlobalHandle>,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
        ::~_Rb_tree((_Rb_tree<helics::GlobalHandle,_helics::GlobalHandle,_std::_Identity<helics::GlobalHandle>,_std::less<helics::GlobalHandle>,_std::allocator<helics::GlobalHandle>_>
                     *)local_98);
      }
    }
  }
  return;
}

Assistant:

void EndpointInfo::checkInterfacesForIssues(std::vector<std::pair<int, std::string>>& issues)
{
    if (!targetedEndpoint) {
        return;
    }
    if (required) {
        if (sourceInformation.empty() && targetInformation.empty()) {
            issues.emplace_back(helics::defs::Errors::CONNECTION_FAILURE,
                                fmt::format("Endpoint {} is required but has no connections", key));
        }
    }
    if (requiredConnections > 0) {
        auto max_connections = (std::max)(targetInformation.size(), sourceInformation.size());
        auto sum_connections = targetInformation.size() + sourceInformation.size();

        if (max_connections > static_cast<size_t>(requiredConnections)) {
            if (requiredConnections == 1) {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format(
                        "Endpoint {} is single source only but has more than one connection", key));
            } else {
                issues.emplace_back(
                    helics::defs::Errors::CONNECTION_FAILURE,
                    fmt::format("Endpoint {} requires {} connections but has at least {}",
                                key,
                                requiredConnections,
                                max_connections));
            }
        } else {
            if (static_cast<std::int32_t>(sum_connections) != requiredConnections) {
                std::set<GlobalHandle> handles;
                for (const auto& src : sourceInformation) {
                    handles.emplace(src.id);
                }
                for (const auto& trg : targetInformation) {
                    handles.emplace(trg.id);
                }
                if (static_cast<std::int32_t>(handles.size()) != requiredConnections) {
                    issues.emplace_back(
                        helics::defs::Errors::CONNECTION_FAILURE,
                        fmt::format("Endpoint {} requires {} connections but has only {}",
                                    key,
                                    requiredConnections,
                                    handles.size()));
                }
            }
        }
    }
}